

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Iterator * __thiscall
kj::_::BTreeImpl::insert(Iterator *__return_storage_ptr__,BTreeImpl *this,SearchKey *searchKey)

{
  NodeUnion *pNVar1;
  uint uVar2;
  Parent *parent;
  Leaf *pLVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  AllocResult<kj::_::BTreeImpl::Parent> AVar7;
  Fault f;
  DebugComparison<unsigned_int,_int> _kjCondition;
  Fault local_50;
  DebugComparison<unsigned_int,_int> local_48;
  
  uVar2 = this->height;
  if ((this->freelistSize < uVar2 + 2) &&
     (((uVar2 == 0 || (this->freelistSize < uVar2)) || ((this->tree->field_0).freelist.zero[6] != 0)
      ))) {
    growTree(this,0);
    if (this->freelistHead == 0) {
      AVar7 = alloc<kj::_::BTreeImpl::Parent>(this);
      local_48.right = 0;
      local_48.left = AVar7.index;
      local_48.op.content.ptr = " == ";
      local_48.op.content.size_ = 5;
      local_48.result = local_48.left == 0;
      if (!local_48.result) {
        Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                  (&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0x170,FAILED,"alloc<Parent>().index == 0","_kjCondition,",&local_48);
        Debug::Fault::fatal(&local_50);
      }
    }
  }
  uVar4 = this->height;
  uVar2 = 0;
  parent = (Parent *)0x0;
  uVar5 = 0;
  while( true ) {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) break;
    parent = insertHelper<kj::_::BTreeImpl::Parent>
                       (this,searchKey,(Parent *)(this->tree + uVar5),parent,uVar2,(uint)uVar5);
    uVar2 = (**searchKey->_vptr_SearchKey)(searchKey,parent);
    uVar5 = (ulong)parent->children[uVar2];
  }
  pLVar3 = insertHelper<kj::_::BTreeImpl::Leaf>
                     (this,searchKey,(Leaf *)(this->tree + uVar5),parent,uVar2,(uint)uVar5);
  pNVar1 = this->tree;
  uVar4 = (*searchKey->_vptr_SearchKey[1])(searchKey,pLVar3);
  __return_storage_ptr__->tree = pNVar1;
  __return_storage_ptr__->leaf = pLVar3;
  __return_storage_ptr__->row = uVar4;
  return __return_storage_ptr__;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::insert(const SearchKey& searchKey) {
  // Like search() but ensures that there is room in the leaf node to insert a new row.

  // If we split the root node it will generate two new nodes. If we split any other node in the
  // path it will generate one new node. `height` doesn't count leaf nodes, but we can equivalently
  // think of it as not counting the root node, so in the worst case we may allocate height + 2
  // new nodes.
  //
  // (Also note that if the tree is currently empty, then `tree` points to a dummy root node in
  // read-only memory. We definitely need to allocate a real tree node array in this case, and
  // we'll start out allocating space for four nodes, which will be all we need up to 28 rows.)
  if (freelistSize < height + 2) {
    if (height > 0 && !tree[0].parent.isFull() && freelistSize >= height) {
      // Slight optimization: The root node is not full, so we're definitely not going to split it.
      // That means that the maximum allocations we might do is equal to `height`, not
      // `height + 2`, and we have that much space, so no need to grow yet.
      //
      // This optimization is particularly important for small trees, e.g. when treeCapacity is 4
      // and the tree so far consists of a root and two children, we definitely don't need to grow
      // the tree yet.
    } else {
      growTree();

      if (freelistHead == 0) {
        // We have no root yet. Allocate one.
        KJ_ASSERT(alloc<Parent>().index == 0);
      }
    }
  }

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = insertHelper(searchKey, tree[pos].parent, parent, indexInParent, pos);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
  }

  Leaf& leaf = insertHelper(searchKey, tree[pos].leaf, parent, indexInParent, pos);

  // Fun fact: Unlike erase(), there's no need to climb back up the tree modifying keys, because
  // either the newly-inserted node will not be the last in the leaf (and thus parent keys aren't
  // modified), or the leaf is the last leaf in the tree (and thus there's no parent key to
  // modify).

  return { tree, &leaf, searchKey.search(leaf) };
}